

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lincost.cc
# Opt level: O2

size_t __thiscall bsplib::LinCost::get_bruck_vol(LinCost *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer puVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char *__assertion;
  ulong __new_size;
  size_t sVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this->m_nprocs == 1) {
    return (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish[-1];
  }
  this_00 = &this->m_sizes;
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  uVar8 = 0;
  uVar9 = 0;
  do {
    puVar1 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    __new_size = (ulong)uVar9;
    if (uVar6 <= uVar8) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,__new_size);
      puVar1 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3 == __new_size) {
        if (*(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start == 0) {
          if (*puVar1 != 0) {
            *puVar1 = *puVar1 - 1;
            iVar5 = uint32_log2(this->m_nprocs - 1);
            puVar1 = (this->m_sizes).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = (long)(this->m_sizes).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
            sVar10 = 0;
            local_48 = 0;
            local_58 = 0;
            dVar13 = 1.79769313486232e+308;
            while (1 < uVar8) {
              sVar2 = puVar1[uVar8 - 1];
              auVar11._8_4_ = (int)(sVar2 >> 0x20);
              auVar11._0_8_ = sVar2;
              auVar11._12_4_ = 0x45300000;
              auVar15._8_4_ = (int)((ulong)local_58 >> 0x20);
              auVar15._0_8_ = local_58;
              auVar15._12_4_ = 0x45300000;
              auVar14._8_4_ = (int)((ulong)local_48 >> 0x20);
              auVar14._0_8_ = local_48;
              auVar14._12_4_ = 0x45300000;
              dVar12 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)) *
                       this->m_beta +
                       ((auVar15._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0)) *
                       this->m_alpha +
                       (((auVar11._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) *
                        (double)this->m_nprocs * this->m_beta + this->m_alpha) * (double)(iVar5 + 1)
              ;
              if (dVar12 < dVar13) {
                sVar10 = sVar2;
              }
              local_58 = local_58 +
                         (this->m_counts).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8 - 1];
              lVar3 = uVar8 - 2;
              uVar8 = uVar8 - 1;
              if (dVar13 <= dVar12) {
                dVar12 = dVar13;
              }
              local_48 = local_48 + (sVar2 - puVar1[lVar3]) * local_58;
              dVar13 = dVar12;
            }
            uStack_40 = 0;
            uStack_50 = 0;
            reset(this,this->m_nprocs);
            if (dVar13 <= (((double)CONCAT44(0x45300000,local_58._4_4_) - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(undefined4)local_58) - 4503599627370496.0))
                          * this->m_alpha +
                          (((double)CONCAT44(0x45300000,local_48._4_4_) - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(undefined4)local_48) - 4503599627370496.0))
                          * this->m_beta) {
              return sVar10;
            }
            return 0;
          }
          __assertion = "m_counts[0] >= 1";
          uVar9 = 0x31;
        }
        else {
          __assertion = "m_sizes[0] == 0";
          uVar9 = 0x30;
        }
      }
      else {
        __assertion = "m_counts.size() == k";
        uVar9 = 0x2f;
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/lincost.cc"
                    ,uVar9,"std::size_t bsplib::LinCost::get_bruck_vol()");
    }
    uVar4 = 1;
    do {
      local_60 = uVar4;
      iVar5 = (int)local_60;
      uVar7 = (ulong)(uint)((int)uVar8 + iVar5);
      if (uVar6 <= uVar7) break;
      uVar4 = (ulong)(iVar5 + 1);
    } while (puVar1[uVar8] == puVar1[uVar7]);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->m_counts,&local_60);
    puVar1 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar1[__new_size] = puVar1[uVar8];
    uVar9 = uVar9 + 1;
    uVar8 = (ulong)(uint)(iVar5 + (int)uVar8);
  } while( true );
}

Assistant:

std::size_t LinCost::get_bruck_vol()
{
    if ( m_nprocs == 1 ) return m_sizes.back();

    // Make sure the list m_sizes consists of unique numbers, sorted in
    // increasing order, while m_counts contains the multiplicity
    std::sort( m_sizes.begin(), m_sizes.end() );
    unsigned k = 0;
    for ( unsigned i = 0, j=0; i < m_sizes.size(); i=j ) {

        for (j=i+1 ; j < m_sizes.size(); ++j ) 
            if ( m_sizes[i] != m_sizes[j] )
                break;

        m_counts.push_back( j-i );
        m_sizes[k] = m_sizes[i];
        k++;
    }
    m_sizes.resize(k);
    assert( m_counts.size() == k );
    assert( m_sizes[0] == 0 );
    assert( m_counts[0] >= 1);
    m_counts[0] -= 1; // remove one occurrence of zero


    // now we can find the minimum cost
    double min_cost = std::numeric_limits<double>::max();
    std::size_t min_m = 0;
    std::size_t p2p_volume = 0, relation = 0;
    int logP = 1 + int_log2( m_nprocs-1 );
    for ( std::size_t i = m_sizes.size(); i > 1; --i ) {
        std::size_t m = m_sizes[i-1];

        double cost = logP * ( m_alpha + m_beta * m_nprocs * m ) + 
            relation * m_alpha + p2p_volume * m_beta;

        if (cost < min_cost) {
            min_cost = cost;
            min_m = m;
        }

        relation += m_counts[i-1];
        std::size_t next_m = m_sizes[i-2];
        p2p_volume += relation * (m - next_m);
    }
    reset(m_nprocs);
    // now test for m = zero
    if ( relation * m_alpha + p2p_volume * m_beta < min_cost ) {
        return 0;
    }
    return min_m;
}